

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O3

void __thiscall Disa::Adjacency_Graph<false>::resize(Adjacency_Graph<false> *this,size_t *size)

{
  size_type __new_size;
  pointer puVar1;
  unsigned_long uVar2;
  ulong *puVar3;
  ulong *puVar4;
  pointer puVar5;
  pointer puVar6;
  size_t __n;
  long lVar7;
  ulong *__src;
  difference_type __d;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong *__dest;
  unsigned_long local_38;
  
  puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar11 = 0;
  if (puVar6 != puVar5) {
    uVar11 = ((long)puVar6 - (long)puVar5 >> 3) - 1;
  }
  __new_size = *size + 1;
  if (uVar11 < *size) {
    if (puVar5 == puVar6) {
      local_38 = 0;
    }
    else {
      local_38 = puVar6[-1];
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->offset,__new_size,&local_38);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->offset,__new_size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->vertex_adjacent_list,
               (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1]);
    puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)puVar6 - (long)puVar5 != 8 && puVar6 != puVar5) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        puVar1 = (this->vertex_adjacent_list).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = puVar5[uVar11 + 1];
        __dest = puVar1 + puVar5[uVar11];
        uVar8 = (long)(uVar2 * 8 + puVar5[uVar11] * -8) >> 3;
        if (0 < (long)uVar8) {
          do {
            uVar9 = uVar8 >> 1;
            uVar8 = ~uVar9 + uVar8;
            puVar3 = __dest + uVar9 + 1;
            if (*size <= __dest[uVar9]) {
              uVar8 = uVar9;
              puVar3 = __dest;
            }
            __dest = puVar3;
          } while (0 < (long)uVar8);
        }
        puVar3 = puVar1 + uVar2;
        if (__dest != puVar3) {
          __src = puVar1 + uVar2;
          __n = (long)(this->vertex_adjacent_list).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3;
          if (__n != 0) {
            memmove(__dest,__src,__n);
            __src = (this->vertex_adjacent_list).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          }
          puVar4 = (ulong *)(((long)__src - (long)puVar3) + (long)__dest);
          if (__src != puVar4) {
            (this->vertex_adjacent_list).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar4;
          }
          lVar7 = (long)puVar3 - (long)__dest >> 3;
          puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5[uVar11 + 1] = puVar5[uVar11 + 1] - lVar7;
          lVar10 = lVar10 + lVar7;
          puVar6 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        puVar5[uVar11 + 2] = puVar5[uVar11 + 2] - lVar10;
      } while (((long)puVar6 - (long)puVar5 != 0) &&
              (uVar11 = uVar11 + 1, uVar11 < ((long)puVar6 - (long)puVar5 >> 3) - 1U));
    }
  }
  return;
}

Assistant:

void Adjacency_Graph<_directed>::resize(const std::size_t& size) {

  // Branch based on expansion or contraction of the graph.
  if(size_vertex() < size) {
    offset.resize(size + 1, offset.empty() ? 0 : offset.back());
  } else {
    // Resize the containers.
    offset.resize(size + 1);
    vertex_adjacent_list.resize(offset.back());

    // Loop over remaining vertices, looking for edges which no longer exist.
    std::size_t offset_carry = 0;
    FOR(i_vertex, size_vertex()) {
      auto [adjacency_begin, adjacency_end] = vertex_adjacency_iter(i_vertex);
      const auto erase_iter = std::lower_bound(adjacency_begin, adjacency_end, size);
      if(erase_iter != adjacency_end) {
        const auto offset_current = std::distance(erase_iter, adjacency_end);
        vertex_adjacent_list.erase(erase_iter, adjacency_end);
        offset[i_vertex + 1] -= offset_current;
        offset_carry += offset_current;
      }
      offset[i_vertex + 2] -= offset_carry;
    }
  }
}